

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O2

expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
* __thiscall
jaegertracing::Tracer::Extract
          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
           *__return_storage_ptr__,Tracer *this,HTTPHeadersReader *reader)

{
  bool bVar1;
  SpanContext *this_00;
  SpanContext spanContext;
  SpanContext local_178;
  SpanContext local_c8;
  
  propagation::
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  ::extract(&local_c8,
            &(this->_httpHeaderPropagator).
             super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
            ,reader);
  local_178._baggage._M_h._M_buckets = &local_178._baggage._M_h._M_single_bucket;
  local_178.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00297978;
  local_178._traceID._high = 0;
  local_178._traceID._low = 0;
  local_178._spanID = 0;
  local_178._parentID = 0;
  local_178._flags = '\0';
  local_178._baggage._M_h._M_bucket_count = 1;
  local_178._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._baggage._M_h._M_element_count = 0;
  local_178._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_178._baggage._M_h._M_rehash_policy._M_next_resize = 0;
  local_178._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_178._debugID._M_dataplus._M_p = (pointer)&local_178._debugID.field_2;
  local_178._debugID._M_string_length = 0;
  local_178._debugID.field_2._M_local_buf[0] = '\0';
  local_178._mutex.super___mutex_base._M_mutex.__align = 0;
  local_178._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_178._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_178._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  local_178._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  bVar1 = operator==(&local_c8,&local_178);
  SpanContext::~SpanContext(&local_178);
  if (bVar1) {
    __return_storage_ptr__->has_value_ = true;
    (__return_storage_ptr__->contained).m_value._M_t.
    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl = (SpanContext *)0x0;
  }
  else {
    this_00 = (SpanContext *)operator_new(0xb0);
    SpanContext::SpanContext(this_00,&local_c8);
    __return_storage_ptr__->has_value_ = true;
    *(SpanContext **)&__return_storage_ptr__->contained = this_00;
  }
  SpanContext::~SpanContext(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<std::unique_ptr<opentracing::SpanContext>>
    Extract(const opentracing::HTTPHeadersReader& reader) const override
    {
        const auto spanContext = _httpHeaderPropagator.extract(reader);
        if (spanContext == SpanContext()) {
            return std::unique_ptr<opentracing::SpanContext>();
        }
        return std::unique_ptr<opentracing::SpanContext>(
            new SpanContext(spanContext));
    }